

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

void Abc_NtkBalanceAttach(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  Vec_Ptr_t *pVVar1;
  Abc_Obj_t *pAVar2;
  long lVar3;
  
  Abc_NtkCleanCopy(pNtk);
  pVVar1 = pNtk->vCos;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pNode = *(Abc_Obj_t **)
               (*(long *)(*(long *)(*pVVar1->pArray[lVar3] + 0x20) + 8) +
               (long)**(int **)((long)pVVar1->pArray[lVar3] + 0x20) * 8);
      if ((pNode->field_6).pTemp == (void *)0x0) {
        pAVar2 = (Abc_Obj_t *)Abc_NodeFindCone_rec(pNode);
        (pNode->field_6).pCopy = pAVar2;
      }
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vCos;
    } while (lVar3 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
}